

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::SectionInfo::hasUntestedSections(SectionInfo *this)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  bVar1 = true;
  if (this->m_status != Unknown) {
    p_Var2 = (this->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(this->m_subSections)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 == p_Var3) {
      bVar1 = false;
    }
    else {
      do {
        bVar1 = hasUntestedSections(*(SectionInfo **)(p_Var2 + 2));
        if (bVar1) {
          return bVar1;
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  return bVar1;
}

Assistant:

bool hasUntestedSections() const {
            if( m_status == Unknown )
                return true;

            std::map<std::string, SectionInfo*>::const_iterator it = m_subSections.begin();
            std::map<std::string, SectionInfo*>::const_iterator itEnd = m_subSections.end();
            for(; it != itEnd; ++it ) {
                if( it->second->hasUntestedSections() )
                    return true;
            }
            return false;
        }